

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::TypeofElem(Var instance,Var index,ScriptContext *scriptContext)

{
  ThreadContext *this;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  IndexType IVar4;
  int iVar5;
  Var indexVar;
  undefined4 *puVar6;
  JavascriptString *pJVar7;
  undefined1 local_70 [8];
  AutoCatchHandlerExists autoCatchHandlerExists;
  PropertyRecord *debugPropertyRecord;
  RecyclableObject *object;
  Var member;
  PropertyRecord *pPStack_40;
  uint32 indexVal;
  PropertyRecord *propertyRecord;
  
  debugPropertyRecord = (PropertyRecord *)0x0;
  BVar3 = GetPropertyObject(instance,scriptContext,(RecyclableObject **)&debugPropertyRecord);
  if (BVar3 == 0) {
    pJVar7 = GetPropertyDisplayNameForError(index,scriptContext);
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec48,pJVar7);
  }
  object = (RecyclableObject *)0x0;
  pPStack_40 = (PropertyRecord *)0x0;
  this = scriptContext->threadContext;
  propertyRecord._7_1_ = this->implicitCallFlags;
  ThreadContext::ClearImplicitCallFlags(this);
  JavascriptExceptionOperators::AutoCatchHandlerExists::AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_70,scriptContext,true);
  indexVar = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(index,scriptContext);
  IVar4 = GetIndexTypeFromPrimitive
                    (indexVar,scriptContext,(uint32 *)((long)&member + 4),&stack0xffffffffffffffc0,
                     (JavascriptString **)0x0,false,false);
  if (IVar4 == IndexType_PropertyId) {
LAB_00ab27ed:
    if (pPStack_40 == (PropertyRecord *)0x0) {
      bVar2 = CanShortcutOnUnknownPropertyName((RecyclableObject *)debugPropertyRecord);
      if (!bVar2) {
        IVar4 = GetIndexTypeFromPrimitive
                          (indexVar,scriptContext,(uint32 *)((long)&member + 4),
                           &stack0xffffffffffffffc0,(JavascriptString **)0x0,true,false);
        if (IVar4 != IndexType_PropertyId) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1e8,"(indexType == IndexType_PropertyId)",
                                      "indexType == IndexType_PropertyId");
          if (!bVar2) goto LAB_00ab2a45;
          *puVar6 = 0;
        }
        if (pPStack_40 == (PropertyRecord *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                      ,0x1e9,"(propertyRecord != nullptr)",
                                      "propertyRecord != nullptr");
          if (!bVar2) goto LAB_00ab2a45;
          *puVar6 = 0;
        }
      }
    }
    if (pPStack_40 == (PropertyRecord *)0x0) {
      pJVar7 = JavascriptConversion::ToString(indexVar,scriptContext);
      ScriptContext::GetOrAddPropertyRecord
                (scriptContext,pJVar7,(PropertyRecord **)&autoCatchHandlerExists.m_threadContext);
      BVar3 = GetProperty_Internal<false>
                        (instance,(RecyclableObject *)debugPropertyRecord,false,
                         ((autoCatchHandlerExists.m_threadContext)->
                         super_DefaultRecyclerCollectionWrapper).super_RecyclerCollectionWrapper.
                         _isScriptContextCloseGCPending,&object,scriptContext,
                         (PropertyValueInfo *)0x0);
      if (BVar3 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0x1fc,
                                    "(!JavascriptOperators::GetProperty(instance, object, debugPropertyRecord->GetPropertyId(), &member, scriptContext))"
                                    ,
                                    "how did this property come? See OS Bug 2727708 if you see this come from the web"
                                   );
        if (!bVar2) {
LAB_00ab2a45:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
      this->implicitCallFlags = this->implicitCallFlags | propertyRecord._7_1_;
      pJVar7 = StringCache::GetUndefinedDisplay
                         (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache
                         );
      goto LAB_00ab2a0c;
    }
    iVar5 = GetProperty_Internal<false>
                      (instance,(RecyclableObject *)debugPropertyRecord,false,pPStack_40->pid,
                       &object,scriptContext,(PropertyValueInfo *)0x0);
  }
  else {
    if (IVar4 != IndexType_Number) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x1e4,"(indexType == IndexType_PropertyId)",
                                  "indexType == IndexType_PropertyId");
      if (!bVar2) goto LAB_00ab2a45;
      *puVar6 = 0;
      goto LAB_00ab27ed;
    }
    iVar5 = GetItem(instance,(RecyclableObject *)debugPropertyRecord,member._4_4_,&object,
                    scriptContext);
  }
  if (iVar5 == 0) {
    ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
    this->implicitCallFlags = this->implicitCallFlags | propertyRecord._7_1_;
    pJVar7 = StringCache::GetUndefinedDisplay
                       (&((scriptContext->super_ScriptContextBase).javascriptLibrary)->stringCache);
  }
  else {
    ThreadContext::CheckAndResetImplicitCallAccessorFlag(this);
    this->implicitCallFlags = this->implicitCallFlags | propertyRecord._7_1_;
    pJVar7 = (JavascriptString *)Typeof(object,scriptContext);
  }
LAB_00ab2a0c:
  JavascriptExceptionOperators::AutoCatchHandlerExists::~AutoCatchHandlerExists
            ((AutoCatchHandlerExists *)local_70);
  return pJVar7;
}

Assistant:

Var JavascriptOperators::TypeofElem(Var instance, Var index, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofElem);
        RecyclableObject* object = nullptr;

        if (FALSE == JavascriptOperators::GetPropertyObject(instance, scriptContext, &object))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_Property_CannotGet_NullOrUndefined, GetPropertyDisplayNameForError(index, scriptContext));
        }

        Var member = nullptr;
        uint32 indexVal;
        PropertyRecord const * propertyRecord = nullptr;

        ThreadContext* threadContext = scriptContext->GetThreadContext();
        ImplicitCallFlags savedImplicitCallFlags = threadContext->GetImplicitCallFlags();
        threadContext->ClearImplicitCallFlags();

        try
        {
            Js::JavascriptExceptionOperators::AutoCatchHandlerExists autoCatchHandlerExists(scriptContext);
            IndexType indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, false);

            // For JS Objects, don't create the propertyId if not already added
            if (indexType == IndexType_Number)
            {
                // In edge mode, we don't need to worry about the special "unknown" behavior. If the item is not available from Get,
                // just return undefined.
                if (!JavascriptOperators::GetItem(instance, object, indexVal, &member, scriptContext))
                {
                    // If the instance doesn't have the item, typeof result is "undefined".
                    threadContext->CheckAndResetImplicitCallAccessorFlag();
                    threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                    return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                }
            }
            else
            {
                Assert(indexType == IndexType_PropertyId);
                if (propertyRecord == nullptr && !JavascriptOperators::CanShortcutOnUnknownPropertyName(object))
                {
                    indexType = GetIndexTypeFromPrimitive(index, scriptContext, &indexVal, &propertyRecord, true);
                    Assert(indexType == IndexType_PropertyId);
                    Assert(propertyRecord != nullptr);
                }

                if (propertyRecord != nullptr)
                {
                    if (!JavascriptOperators::GetProperty(instance, object, propertyRecord->GetPropertyId(), &member, scriptContext))
                    {
                        // If the instance doesn't have the property, typeof result is "undefined".
                        threadContext->CheckAndResetImplicitCallAccessorFlag();
                        threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                        return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                    }
                }
                else
                {
#if DBG
                    JavascriptString* indexStr = JavascriptConversion::ToString(index, scriptContext);
                    PropertyRecord const * debugPropertyRecord;
                    scriptContext->GetOrAddPropertyRecord(indexStr, &debugPropertyRecord);
                    AssertMsg(!JavascriptOperators::GetProperty(instance, object, debugPropertyRecord->GetPropertyId(), &member, scriptContext), "how did this property come? See OS Bug 2727708 if you see this come from the web");
#endif

                    // If the instance doesn't have the property, typeof result is "undefined".
                    threadContext->CheckAndResetImplicitCallAccessorFlag();
                    threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
                    return scriptContext->GetLibrary()->GetUndefinedDisplayString();
                }
            }
            threadContext->CheckAndResetImplicitCallAccessorFlag();
            threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
            return JavascriptOperators::Typeof(member, scriptContext);
        }
        catch(const JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
            threadContext->CheckAndResetImplicitCallAccessorFlag();
            threadContext->AddImplicitCallFlags(savedImplicitCallFlags);
            return scriptContext->GetLibrary()->GetUndefinedDisplayString();
        }
        JIT_HELPER_END(Op_TypeofElem);
    }